

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O0

ptrlen BinarySource_get_chars_internal(BinarySource *src,char *set,_Bool include)

{
  size_t sVar1;
  _Bool _Var2;
  void *ptr;
  char *pcVar3;
  ptrlen pVar4;
  char *end;
  _Bool present;
  char *start;
  _Bool include_local;
  char *set_local;
  BinarySource *src_local;
  
  ptr = (void *)((long)src->data + src->pos);
  while (_Var2 = BinarySource_data_avail(src,1), _Var2) {
    sVar1 = src->pos;
    src->pos = sVar1;
    pcVar3 = strchr(set,(int)*(char *)((long)src->data + sVar1));
    if ((pcVar3 != (char *)0x0) != include) break;
    src->pos = src->pos + 1;
  }
  pVar4 = make_ptrlen(ptr,(long)src->data + (src->pos - (long)ptr));
  return pVar4;
}

Assistant:

static ptrlen BinarySource_get_chars_internal(
    BinarySource *src, const char *set, bool include)
{
    const char *start = here;
    while (avail(1)) {
        bool present = NULL != strchr(set, *(const char *)consume(0));
        if (present != include)
            break;
        (void) consume(1);
    }
    const char *end = here;
    return make_ptrlen(start, end - start);
}